

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauTree.c
# Opt level: O3

void Dss_NtkTransform(Dss_Ntk_t *p,int *pPermDsd)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  ulong uVar7;
  Dss_Obj_t *pDVar8;
  ulong uVar9;
  Vec_Ptr_t *p_00;
  long lVar10;
  int nPerms;
  Dss_Obj_t *pChildren [12];
  uint local_9c;
  Dss_Obj_t *local_98 [13];
  
  pDVar8 = p->pRoot;
  if ((*(uint *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4) & 7) != 1) {
    p_00 = p->vObjs;
    uVar7 = (ulong)(uint)p_00->nSize;
    if (0 < p_00->nSize) {
      lVar10 = 0;
      do {
        ppvVar3 = p_00->pArray;
        pvVar4 = ppvVar3[lVar10];
        uVar1 = *(uint *)((long)pvVar4 + 4);
        if ((6 < (uVar1 & 7)) || ((0x66U >> (uVar1 & 7) & 1) == 0)) {
          if (0x7ffffff < uVar1) {
            uVar9 = 0;
            do {
              uVar2 = *(uint *)((long)pvVar4 + uVar9 * 4 + 8);
              if ((int)uVar2 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf2,"int Abc_Lit2Var(int)");
              }
              if ((int)uVar7 <= (int)(uVar2 >> 1)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar5 = ppvVar3[uVar2 >> 1];
              if (pvVar5 == (void *)(ulong)(uVar2 & 1)) break;
              local_98[uVar9] = (Dss_Obj_t *)((ulong)pvVar5 ^ (ulong)(uVar2 & 1));
              uVar9 = uVar9 + 1;
            } while (uVar1 >> 0x1b != uVar9);
          }
          Dss_ObjSort(p_00,local_98,uVar1 >> 0x1b,(int *)0x0);
          uVar1 = *(uint *)((long)pvVar4 + 4);
          if (0x7ffffff < uVar1) {
            uVar7 = 0;
            do {
              iVar6 = *(int *)((ulong)local_98[uVar7] & 0xfffffffffffffffe);
              if (iVar6 < 0) {
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf1,"int Abc_Var2Lit(int, int)");
              }
              *(uint *)((long)pvVar4 + uVar7 * 4 + 8) = ((uint)local_98[uVar7] & 1) + iVar6 * 2;
              uVar7 = uVar7 + 1;
            } while (uVar7 < uVar1 >> 0x1b);
          }
        }
        lVar10 = lVar10 + 1;
        p_00 = p->vObjs;
        uVar7 = (ulong)p_00->nSize;
      } while (lVar10 < (long)uVar7);
      pDVar8 = p->pRoot;
    }
    local_9c = 0;
    iVar6 = Dss_NtkCollectPerm_rec(p,pDVar8,pPermDsd,(int *)&local_9c);
    pDVar8 = p->pRoot;
    if (iVar6 != 0) {
      pDVar8 = (Dss_Obj_t *)((ulong)pDVar8 & 0xfffffffffffffffe);
      p->pRoot = pDVar8;
    }
    if (local_9c != (*(uint *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4) >> 3 & 0xff)) {
      __assert_fail("nPerms == (int)Dss_Regular(p->pRoot)->nSupp",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                    ,0x2e9,"void Dss_NtkTransform(Dss_Ntk_t *, int *)");
    }
  }
  return;
}

Assistant:

void Dss_NtkTransform( Dss_Ntk_t * p, int * pPermDsd )
{
    Dss_Obj_t * pChildren[DAU_MAX_VAR];
    Dss_Obj_t * pObj, * pChild;
    int i, k, nPerms;
    if ( Dss_Regular(p->pRoot)->Type == DAU_DSD_CONST0 )
        return;
    Dss_VecForEachNode( p->vObjs, pObj, i )
    {
        if ( pObj->Type == DAU_DSD_MUX || pObj->Type == DAU_DSD_PRIME )
            continue;
        Dss_ObjForEachChild( p->vObjs, pObj, pChild, k )
            pChildren[k] = pChild;
        Dss_ObjSort( p->vObjs, pChildren, Dss_ObjFaninNum(pObj), NULL );
        for ( k = 0; k < Dss_ObjFaninNum(pObj); k++ )
            pObj->pFans[k] = Dss_Obj2Lit( pChildren[k] );
    }
    nPerms = 0;
    if ( Dss_NtkCollectPerm_rec( p, p->pRoot, pPermDsd, &nPerms ) )
        p->pRoot = Dss_Regular(p->pRoot);
    assert( nPerms == (int)Dss_Regular(p->pRoot)->nSupp );
}